

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

local_m_map_t * __thiscall
tchecker::clockbounds::local_m_map_t::operator=(local_m_map_t *this,local_m_map_t *m)

{
  local_m_map_t *m_local;
  local_m_map_t *this_local;
  
  if (this != m) {
    clear(this);
    this->_loc_nb = m->_loc_nb;
    this->_clock_nb = m->_clock_nb;
    std::
    vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ::operator=(&this->_M,&m->_M);
    std::
    vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ::clear(&m->_M);
    m->_loc_nb = 0;
    m->_clock_nb = 0;
  }
  return this;
}

Assistant:

tchecker::clockbounds::local_m_map_t & local_m_map_t::operator=(tchecker::clockbounds::local_m_map_t && m)
{
  if (this != &m) {
    clear();

    _loc_nb = std::move(m._loc_nb);
    _clock_nb = std::move(m._clock_nb);
    _M = std::move(m._M);

    m._M.clear();
    m._loc_nb = 0;
    m._clock_nb = 0;
  }
  return *this;
}